

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeEventCreate
          (ze_event_pool_handle_t hEventPool,ze_event_desc_t *desc,ze_event_handle_t *phEvent)

{
  _func_void__ze_event_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_event_pool_handle_t_ptr__ze_event_desc_t_ptr__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  undefined1 local_d0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnEventCreateCb_t epilogue_callback_ptr;
  ze_pfnEventCreateCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_event_create_params_t tracerParams;
  ze_pfnEventCreate_t pfnCreate;
  ze_event_handle_t *phEvent_local;
  ze_event_desc_t *desc_local;
  ze_event_pool_handle_t hEventPool_local;
  
  if (DAT_002da6d8 ==
      (_func__ze_result_t__ze_event_pool_handle_t_ptr__ze_event_desc_t_ptr__ze_event_handle_t_ptr_ptr
       *)0x0) {
    hEventPool_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnCreate = (ze_pfnEventCreate_t)phEvent;
    phEvent_local = (ze_event_handle_t *)desc;
    desc_local = (ze_event_desc_t *)hEventPool;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&desc_local;
      APITracerCallbackDataImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnEventCreateCb_t)0x0;
            prologueCallbackPtr < (ze_pfnEventCreateCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x370);
          p_Var1 = *(_func_void__ze_event_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **)
                    (puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x9c8);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_event_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **)
                (puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_d0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d0)
          ;
        }
      }
      zeApiPtr = DAT_002da6d8;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_e8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_100,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hEventPool_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_event_pool_handle_t*,_ze_event_desc_t_const*,_ze_event_handle_t**),_ze_event_create_params_t*,void(*)(_ze_event_create_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_event_create_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_event_create_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_event_create_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_event_create_params_t*,_ze_result_t,void*,void**)>>>,_ze_event_pool_handle_t*&,_ze_event_desc_t_const*&,_ze_event_handle_t**&>
                     (zeApiPtr,(_ze_event_create_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_event_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *
                      )currentTracerArray,&local_e8,&local_100,
                      (_ze_event_pool_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_event_desc_t **)&phEvent_local,(_ze_event_handle_t ***)&pfnCreate);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_e8);
      APITracerCallbackDataImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_event_create_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hEventPool_local._4_4_ =
           (*DAT_002da6d8)((_ze_event_pool_handle_t *)desc_local,(_ze_event_desc_t *)phEvent_local,
                           (_ze_event_handle_t **)pfnCreate);
    }
  }
  return hEventPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventCreate(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        const ze_event_desc_t* desc,                    ///< [in] pointer to event descriptor
        ze_event_handle_t* phEvent                      ///< [out] pointer to handle of event object created
        )
    {
        auto pfnCreate = context.zeDdiTable.Event.pfnCreate;

        if( nullptr == pfnCreate)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Event.pfnCreate, hEventPool, desc, phEvent);

        // capture parameters
        ze_event_create_params_t tracerParams = {
            &hEventPool,
            &desc,
            &phEvent
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnEventCreateCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnEventCreateCb_t, Event, pfnCreateCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Event.pfnCreate,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phEventPool,
                                                  *tracerParams.pdesc,
                                                  *tracerParams.pphEvent);
    }